

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O3

void Assimp::FBX::TokenizeBinary(TokenList *output_tokens,char *input,size_t length)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  char *end;
  char *cursor;
  string local_48;
  
  if (length < 0x1b) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"file is too short","");
    anon_unknown_3::TokenizeError(&local_48,0);
  }
  iVar2 = strncmp(input,"Kaydara FBX Binary",0x12);
  if (iVar2 == 0) {
    local_48._M_dataplus._M_p = input + 0x12;
    end = input + length;
    anon_unknown_3::ReadByte(input,(char **)&local_48,end);
    anon_unknown_3::ReadByte(input,(char **)&local_48,end);
    anon_unknown_3::ReadByte(input,(char **)&local_48,end);
    anon_unknown_3::ReadByte(input,(char **)&local_48,end);
    anon_unknown_3::ReadByte(input,(char **)&local_48,end);
    uVar3 = anon_unknown_3::ReadWord(input,(char **)&local_48,end);
    do {
      if (end <= local_48._M_dataplus._M_p) {
        return;
      }
      bVar1 = anon_unknown_3::ReadScope(output_tokens,input,(char **)&local_48,end,0x1d4b < uVar3);
    } while (bVar1);
    return;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"magic bytes not found","");
  anon_unknown_3::TokenizeError(&local_48,0);
}

Assistant:

void TokenizeBinary(TokenList& output_tokens, const char* input, size_t length)
{
    ai_assert(input);

    if(length < 0x1b) {
        TokenizeError("file is too short",0);
    }

    //uint32_t offset = 0x15;
/*    const char* cursor = input + 0x15;

    const uint32_t flags = ReadWord(input, cursor, input + length);

    const uint8_t padding_0 = ReadByte(input, cursor, input + length); // unused
    const uint8_t padding_1 = ReadByte(input, cursor, input + length); // unused*/

    if (strncmp(input,"Kaydara FBX Binary",18)) {
        TokenizeError("magic bytes not found",0);
    }

    const char* cursor = input + 18;
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	const uint32_t version = ReadWord(input, cursor, input + length);
	const bool is64bits = version >= 7500;
    const char *end = input + length;
    while (cursor < end ) {
		if (!ReadScope(output_tokens, input, cursor, input + length, is64bits)) {
            break;
        }
    }
}